

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cc
# Opt level: O0

string * __thiscall
InputSource::read_line_abi_cxx11_
          (string *__return_storage_ptr__,InputSource *this,size_t count,qpdf_offset_t at)

{
  allocator<char> local_2a;
  undefined1 local_29;
  qpdf_offset_t local_28;
  qpdf_offset_t at_local;
  size_t count_local;
  InputSource *this_local;
  string *result;
  
  local_29 = 0;
  local_28 = at;
  at_local = count;
  count_local = (size_t)this;
  this_local = (InputSource *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,count,'\0',&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  read_line(this,__return_storage_ptr__,at_local,local_28);
  return __return_storage_ptr__;
}

Assistant:

inline std::string
InputSource::read_line(size_t count, qpdf_offset_t at)
{
    std::string result(count, '\0');
    read_line(result, count, at);
    return result;
}